

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationData::getLastPrimaryForGroup(CollationData *this,int32_t script)

{
  int32_t iVar1;
  uint32_t limit;
  int32_t index;
  int32_t script_local;
  CollationData *this_local;
  
  iVar1 = getScriptIndex(this,script);
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = (uint)this->scriptStarts[iVar1 + 1] * 0x10000 - 1;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationData::getLastPrimaryForGroup(int32_t script) const {
    int32_t index = getScriptIndex(script);
    if(index == 0) {
        return 0;
    }
    uint32_t limit = scriptStarts[index + 1];
    return (limit << 16) - 1;
}